

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SigmaStarAbstract.h
# Opt level: O2

DFA<covenant::Sym> * __thiscall
covenant::SigmaStarAbstract<covenant::Sym>::do_abstraction
          (DFA<covenant::Sym> *__return_storage_ptr__,SigmaStarAbstract<covenant::Sym> *this,CFG *g,
          bool is_regular)

{
  bool bVar1;
  State s;
  int iVar2;
  size_type sVar3;
  string *this_00;
  sp_counted_base *__addr_len;
  sockaddr *__addr;
  int iVar4;
  int iVar5;
  DFA<covenant::Sym> sfa;
  string local_318 [32];
  element_type *local_2f8;
  shared_count local_2f0;
  DFA<covenant::Sym> local_2e8;
  DFA<covenant::Sym> dfa;
  CFG local_b0;
  
  sfa._tfac.px = (g->_tfac).px;
  __addr_len = (g->_tfac).pn.pi_;
  if (__addr_len == (sp_counted_base *)0x0) {
    sfa._tfac.pn.pi_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    __addr_len->use_count_ = __addr_len->use_count_ + 1;
    UNLOCK();
    LOCK();
    __addr_len->use_count_ = __addr_len->use_count_ + 1;
    UNLOCK();
    sfa._tfac.pn.pi_ = __addr_len;
  }
  sfa.start = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  sfa.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sfa.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sfa.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._4_8_ = 0;
  local_2f8 = sfa._tfac.px;
  local_2f0.pi_ = __addr_len;
  boost::detail::shared_count::~shared_count(&local_2f0);
  if (is_regular) {
    if (avy::AvyLogFlag != '\0') {
      std::__cxx11::string::string((string *)&dfa,"verbose",(allocator *)&local_2e8);
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)avy::AvyLog_abi_cxx11_,(key_type *)&dfa);
      std::__cxx11::string::~string((string *)&dfa);
      if (sVar3 != 0) {
        std::operator<<((ostream *)&std::cout,"The CFG is regular thus no need to abstract.\n");
      }
    }
    CFG::CFG(&local_b0,g);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)&dfa,&local_b0);
    CFG::~CFG(&local_b0);
    StronglyRegularToFA<covenant::Sym>::make_fa
              (&local_2e8,(StronglyRegularToFA<covenant::Sym> *)&dfa);
    DFA<covenant::Sym>::operator=(&sfa,&local_2e8);
    DFA<covenant::Sym>::~DFA(&local_2e8);
    StronglyRegularToFA<covenant::Sym>::~StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)&dfa);
  }
  else {
    if (avy::AvyLogFlag != '\0') {
      std::__cxx11::string::string((string *)&dfa,"verbose",(allocator *)&local_2e8);
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)avy::AvyLog_abi_cxx11_,(key_type *)&dfa);
      std::__cxx11::string::~string((string *)&dfa);
      if (sVar3 != 0) {
        std::operator<<((ostream *)&std::cout,"Applied Sigma* abstraction.\n");
      }
    }
    s = DFA<covenant::Sym>::state(&sfa,0);
    sfa.start = (int)s;
    DFA<covenant::Sym>::accept(&sfa,s.id,__addr,(socklen_t *)__addr_len);
    DFA<covenant::Sym>::eps_transition(&sfa,s,s);
    iVar2 = g->alphstart;
    iVar5 = iVar2 * 2;
    for (iVar4 = iVar2; iVar4 < iVar2 + g->alphsz; iVar4 = iVar4 + 1) {
      dfa._tfac.px._0_4_ = iVar5;
      DFA<covenant::Sym>::transition(&sfa,s,(Sym *)&dfa,s);
      iVar2 = g->alphstart;
      iVar5 = iVar5 + 2;
    }
  }
  DFA<covenant::Sym>::eps_elim(&sfa);
  DFA<covenant::Sym>::makeDFA(&dfa,&sfa,g->alphstart,g->alphsz);
  DFA<covenant::Sym>::minimize(__return_storage_ptr__,&dfa,g->alphstart,g->alphsz);
  bVar1 = DFA<covenant::Sym>::eliminateDeadStates(__return_storage_ptr__);
  if (bVar1) {
    DFA<covenant::Sym>::~DFA(&dfa);
    DFA<covenant::Sym>::~DFA(&sfa);
    return __return_storage_ptr__;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            (local_318,"One CFG is trivially empty.\n======\nUNSAT\n======",(allocator *)&local_2e8)
  ;
  std::__cxx11::string::string(this_00,local_318);
  __cxa_throw(this_00,&Exit::typeinfo,Exit::~Exit);
}

Assistant:

DFA<EdgeSym> do_abstraction(CFG &g, const bool is_regular)
  {
    DFA<EdgeSym> sfa (g.getTermFactory ());
    if (is_regular)
    {        
      LOG("verbose", cout << "The CFG is regular thus no need to abstract.\n");
      StronglyRegularToFA<EdgeSym>  conv(g);
      sfa = conv.make_fa();
    }
    else
    {
      LOG("verbose", cout << "Applied Sigma* abstraction.\n");
      State q0 = sfa.state(0);
      sfa.setStart(q0);
      sfa.accept(q0);
      sfa.eps_transition(q0,q0); 
      for (int i=g.alphstart; i<g.alphstart+g.alphsz; i++)
      {
        sfa.transition(q0,EdgeSym::mkTerm(i), q0);
      }
    }

    sfa.eps_elim();
    DFA<EdgeSym> dfa     = sfa.makeDFA(g.alphstart, g.alphsz);
    DFA<EdgeSym> min_dfa = dfa.minimize(g.alphstart, g.alphsz);
    bool is_not_empty    = min_dfa.eliminateDeadStates();
    if (!is_not_empty)
    {
      throw Exit("One CFG is trivially empty.\n======\nUNSAT\n======");
    }
    
    return min_dfa;
  }